

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O3

TokenType __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
skip(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
     *this)

{
  char *pcVar1;
  byte *in_RAX;
  UTF8Reader UVar2;
  TokenType TVar3;
  UTF8Reader t;
  UTF8Reader local_18;
  
  if (this->shouldIgnoreComments == true) {
    local_18.data = (char *)in_RAX;
    skipWhitespaceAndComments(this);
    UVar2.data = (this->input).data;
  }
  else {
    local_18.data = (this->input).data;
    while (((byte)*local_18.data - 9 < 5 || (*local_18.data == 0x20))) {
      UTF8Reader::operator++(&local_18);
    }
    (this->input).data = local_18.data;
    UVar2.data = local_18.data;
  }
  (this->location).location.data = UVar2.data;
  pcVar1 = (this->currentType).text;
  TVar3 = matchNextToken(this);
  (this->currentType).text = TVar3.text;
  return (TokenType)pcVar1;
}

Assistant:

TokenType skip()
    {
        if (shouldIgnoreComments)
            skipWhitespaceAndComments();
        else
            input = input.findEndOfWhitespace();

        location.location = input;
        auto last = currentType;
        currentType = matchNextToken();
        return last;
    }